

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

void __thiscall
QRhiPassResourceTracker::registerBuffer
          (QRhiPassResourceTracker *this,QRhiBuffer *buf,int slot,BufferAccess *access,
          BufferStage *stage,UsageState *state)

{
  byte bVar1;
  BufferStage BVar2;
  undefined4 uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  undefined4 uVar6;
  ulong uVar7;
  uint uVar8;
  BufferStage BVar9;
  long in_FS_OFFSET;
  iterator iVar10;
  QRhiBuffer *copy;
  Buffer local_58;
  QRhiPassResourceTracker local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.m_buffers.d = (Data *)buf;
  iVar10 = QHash<QRhiBuffer*,QRhiPassResourceTracker::Buffer>::findImpl<QRhiBuffer*>
                     ((QHash<QRhiBuffer*,QRhiPassResourceTracker::Buffer> *)this,
                      (QRhiBuffer **)&local_40);
  if (iVar10.i.d == (Data<QHashPrivate::Node<QRhiBuffer_*,_QRhiPassResourceTracker::Buffer>_> *)0x0
      && iVar10.i.bucket == 0) {
    local_58.access = *access;
    local_58.slot = slot;
    local_58.stage = *stage;
    uVar3 = state->layout;
    uVar6 = state->access;
    local_58.stateAtPassBegin.stage = state->stage;
    local_40.m_textures.d = (Data *)local_40.m_buffers.d;
    local_58.stateAtPassBegin.layout = uVar3;
    local_58.stateAtPassBegin.access = uVar6;
    QHash<QRhiBuffer*,QRhiPassResourceTracker::Buffer>::
    emplace<QRhiPassResourceTracker::Buffer_const&>
              ((QHash<QRhiBuffer*,QRhiPassResourceTracker::Buffer> *)this,
               (QRhiBuffer **)&local_40.m_textures,&local_58);
  }
  else {
    pSVar4 = (iVar10.i.d)->spans;
    uVar7 = iVar10.i.bucket >> 7;
    uVar8 = (uint)iVar10.i.bucket & 0x7f;
    pEVar5 = pSVar4[uVar7].entries;
    bVar1 = pSVar4[uVar7].offsets[uVar8];
    if (*(BufferAccess *)(pEVar5[bVar1].storage.data + 0xc) == *access) {
      BVar2 = *(BufferStage *)(pEVar5[bVar1].storage.data + 0x10);
      BVar9 = *stage;
      if (BVar2 != BVar9) {
        if ((int)BVar2 < (int)BVar9) {
          BVar9 = BVar2;
        }
        *(BufferStage *)(pEVar5[bVar1].storage.data + 0x10) = BVar9;
        *stage = *(BufferStage *)(pEVar5[pSVar4[uVar7].offsets[uVar8]].storage.data + 0x10);
      }
    }
    else {
      registerBuffer(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiPassResourceTracker::registerBuffer(QRhiBuffer *buf, int slot, BufferAccess *access, BufferStage *stage,
                                             const UsageState &state)
{
    auto it = m_buffers.find(buf);
    if (it != m_buffers.end()) {
        if (it->access != *access) {
            const QByteArray name = buf->name();
            qWarning("Buffer %p (%s) used with different accesses within the same pass, this is not allowed.",
                     buf, name.constData());
            return;
        }
        if (it->stage != *stage) {
            it->stage = earlierStage(it->stage, *stage);
            *stage = it->stage;
        }
        return;
    }

    Buffer b;
    b.slot = slot;
    b.access = *access;
    b.stage = *stage;
    b.stateAtPassBegin = state; // first use -> initial state
    m_buffers.insert(buf, b);
}